

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

block_state deflate_fast(deflate_state *s,int flush)

{
  ushort uVar1;
  Posf *pPVar2;
  Posf *pPVar3;
  byte bVar4;
  uint uVar5;
  z_uInt zVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  z_uInt zVar10;
  z_Bytef *pzVar11;
  z_uInt zVar12;
  IPos cur_match;
  bool bVar13;
  bool bVar14;
  
  cur_match = 0;
  do {
    if (s->lookahead < 0x106) {
      fill_window(s);
      if (flush == 0 && s->lookahead < 0x106) {
        return need_more;
      }
      if (s->lookahead == 0) {
        iVar7 = s->block_start;
        if ((long)iVar7 < 0) {
          pzVar11 = (z_Bytef *)0x0;
        }
        else {
          pzVar11 = s->window + iVar7;
        }
        _tr_flush_block(s,(z_charf *)pzVar11,s->strstart - iVar7,(uint)(flush == 4));
        s->block_start = s->strstart;
        flush_pending(s->strm);
        if (s->strm->avail_out != 0) {
          return (uint)(flush == 4) * 2 + block_done;
        }
        return (uint)(flush == 4) * 2;
      }
    }
    if (2 < s->lookahead) {
      uVar5 = s->strstart;
      uVar9 = ((uint)s->window[uVar5 + 2] ^ s->ins_h << ((byte)s->hash_shift & 0x1f)) & s->hash_mask
      ;
      s->ins_h = uVar9;
      pPVar2 = s->head;
      uVar1 = pPVar2[uVar9];
      cur_match = (IPos)uVar1;
      s->prev[s->w_mask & uVar5] = uVar1;
      pPVar2[uVar9] = (Posf)uVar5;
    }
    if ((cur_match != 0) && (uVar5 = s->strstart - cur_match, uVar5 <= s->w_size - 0x106)) {
      if ((s->strategy & 0xfffffffeU) == 2) {
        if (uVar5 != 1 || s->strategy != 3) goto LAB_0069f60e;
        zVar6 = longest_match_fast(s,cur_match);
      }
      else {
        zVar6 = longest_match(s,cur_match);
      }
      s->match_length = zVar6;
    }
LAB_0069f60e:
    if (s->match_length < 3) {
      bVar4 = s->window[s->strstart];
      uVar5 = s->last_lit;
      s->d_buf[uVar5] = 0;
      s->last_lit = uVar5 + 1;
      s->l_buf[uVar5] = bVar4;
      s->dyn_ltree[bVar4].fc.freq = s->dyn_ltree[bVar4].fc.freq + 1;
      bVar14 = s->last_lit == s->lit_bufsize - 1;
      s->lookahead = s->lookahead - 1;
      s->strstart = s->strstart + 1;
    }
    else {
      bVar4 = (char)s->match_length - 3;
      iVar7 = s->strstart - s->match_start;
      uVar5 = s->last_lit;
      s->d_buf[uVar5] = (ushf)iVar7;
      s->last_lit = uVar5 + 1;
      s->l_buf[uVar5] = bVar4;
      s->dyn_ltree[(ulong)""[bVar4] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[bVar4] + 0x101].fc.freq + 1;
      uVar8 = iVar7 - 1;
      uVar9 = uVar8 & 0xffff;
      uVar5 = (uVar9 >> 7) + 0x100;
      if (uVar9 < 0x100) {
        uVar5 = uVar8;
      }
      s->dyn_dtree[""[uVar5 & 0xffff]].fc.freq = s->dyn_dtree[""[uVar5 & 0xffff]].fc.freq + 1;
      bVar14 = s->last_lit == s->lit_bufsize - 1;
      uVar5 = s->match_length;
      uVar9 = s->lookahead - uVar5;
      s->lookahead = uVar9;
      if (uVar9 < 3 || s->max_lazy_match < uVar5) {
        zVar6 = s->strstart;
        uVar9 = zVar6 + uVar5;
        s->strstart = uVar9;
        s->match_length = 0;
        uVar9 = (uint)s->window[uVar9];
        s->ins_h = uVar9;
        s->ins_h = ((uint)s->window[zVar6 + uVar5 + 1] ^ uVar9 << ((byte)s->hash_shift & 0x1f)) &
                   s->hash_mask;
      }
      else {
        s->match_length = uVar5 - 1;
        zVar6 = s->hash_shift;
        pzVar11 = s->window;
        uVar9 = s->hash_mask;
        pPVar2 = s->head;
        pPVar3 = s->prev;
        uVar8 = s->w_mask;
        zVar12 = s->ins_h;
        zVar10 = uVar5 - 2;
        uVar5 = s->strstart + 1;
        do {
          s->strstart = uVar5;
          zVar12 = ((uint)pzVar11[uVar5 + 2] ^ zVar12 << ((byte)zVar6 & 0x1f)) & uVar9;
          s->ins_h = zVar12;
          uVar1 = pPVar2[zVar12];
          cur_match = (IPos)uVar1;
          pPVar3[uVar8 & uVar5] = uVar1;
          pPVar2[zVar12] = (Posf)uVar5;
          s->match_length = zVar10;
          uVar5 = uVar5 + 1;
          bVar13 = zVar10 != 0;
          zVar10 = zVar10 - 1;
        } while (bVar13);
        s->strstart = uVar5;
      }
    }
    if (bVar14) {
      iVar7 = s->block_start;
      if ((long)iVar7 < 0) {
        pzVar11 = (z_Bytef *)0x0;
      }
      else {
        pzVar11 = s->window + iVar7;
      }
      _tr_flush_block(s,(z_charf *)pzVar11,s->strstart - iVar7,0);
      s->block_start = s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  } while( true );
}

Assistant:

local block_state deflate_fast(s, flush)
    deflate_state *s;
    int flush;
{
    IPos hash_head = NIL; /* head of the hash chain */
    int bflush;           /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            fill_window(s);
            if (s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH) {
                return need_more;
            }
            if (s->lookahead == 0) break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        if (s->lookahead >= MIN_MATCH) {
            INSERT_STRING(s, s->strstart, hash_head);
        }

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && s->strstart - hash_head <= MAX_DIST(s)) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
#ifdef FASTEST
            if ((s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) ||
                (s->strategy == Z_RLE && s->strstart - hash_head == 1)) {
                s->match_length = longest_match_fast (s, hash_head);
            }
#else
            if (s->strategy != Z_HUFFMAN_ONLY && s->strategy != Z_RLE) {
                s->match_length = longest_match (s, hash_head);
            } else if (s->strategy == Z_RLE && s->strstart - hash_head == 1) {
                s->match_length = longest_match_fast (s, hash_head);
            }
#endif
            /* longest_match() or longest_match_fast() sets match_start */
        }
        if (s->match_length >= MIN_MATCH) {
            check_match(s, s->strstart, s->match_start, s->match_length);

            _tr_tally_dist(s, s->strstart - s->match_start,
                           s->match_length - MIN_MATCH, bflush);

            s->lookahead -= s->match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
#ifndef FASTEST
            if (s->match_length <= s->max_insert_length &&
                s->lookahead >= MIN_MATCH) {
                s->match_length--; /* string at strstart already in table */
                do {
                    s->strstart++;
                    INSERT_STRING(s, s->strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
                } while (--s->match_length != 0);
                s->strstart++;
            } else
#endif
            {
                s->strstart += s->match_length;
                s->match_length = 0;
                s->ins_h = s->window[s->strstart];
                UPDATE_HASH(s, s->ins_h, s->window[s->strstart+1]);
#if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
                /* If lookahead < MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr,"%c", s->window[s->strstart]));
            _tr_tally_lit (s, s->window[s->strstart], bflush);
            s->lookahead--;
            s->strstart++;
        }
        if (bflush) FLUSH_BLOCK(s, 0);
    }
    FLUSH_BLOCK(s, flush == Z_FINISH);
    return flush == Z_FINISH ? finish_done : block_done;
}